

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnTryTableCatch(SharedValidator *this,Location *loc,TableCatch *catch_)

{
  Var *this_00;
  size_t sVar1;
  undefined8 uVar2;
  CatchKind CVar3;
  Result RVar4;
  char *pcVar5;
  int __c;
  int extraout_EDX;
  TableCatch *extraout_RDX;
  bool bVar7;
  TagType tag_type;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_88;
  undefined1 local_70 [80];
  TableCatch *pTVar6;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = (loc->filename)._M_len;
  pcVar5 = (loc->filename)._M_str;
  uVar2 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar2;
  (this->expr_loc_).filename._M_len = sVar1;
  (this->expr_loc_).filename._M_str = pcVar5;
  CVar3 = catch_->kind;
  if ((CVar3 & ~CatchRef) == CatchAll) {
    bVar7 = false;
    pTVar6 = catch_;
  }
  else {
    this_00 = (Var *)(local_70 + 8);
    Var::Var(this_00,&catch_->tag);
    loc = (Location *)this_00;
    RVar4 = CheckTagIndex(this,this_00,(TagType *)&local_88);
    bVar7 = RVar4.enum_ == Error;
    Var::~Var(this_00);
    CVar3 = catch_->kind;
    pTVar6 = extraout_RDX;
  }
  __c = (int)pTVar6;
  if ((CVar3 & ~CatchAll) == CatchRef) {
    loc = (Location *)local_70;
    local_70._0_8_ = 0xffffffe9;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_88,(Type *)loc);
    __c = extraout_EDX;
  }
  pcVar5 = Var::index(&catch_->target,(char *)loc,__c);
  RVar4 = TypeChecker::OnTryTableCatch(&this->typechecker_,(TypeVector *)&local_88,(Index)pcVar5);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_88);
  return (Result)(uint)(byte)(bVar7 | RVar4.enum_ == Error);
}

Assistant:

Result SharedValidator::OnTryTableCatch(const Location& loc,
                                        const TableCatch& catch_) {
  Result result = Result::Ok;
  TagType tag_type;
  expr_loc_ = loc;
  if (!catch_.IsCatchAll()) {
    result |= CheckTagIndex(catch_.tag, &tag_type);
  }
  if (catch_.IsRef()) {
    tag_type.params.push_back(Type::ExnRef);
  }
  result |=
      typechecker_.OnTryTableCatch(tag_type.params, catch_.target.index());
  return result;
}